

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test
::TestBody(SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test *this)

{
  bool bVar1;
  string *psVar2;
  Tenor *pTVar3;
  Date *pDVar4;
  Date *this_00;
  undefined8 *puVar5;
  char *pcVar6;
  AssertHelper local_160;
  Message local_158;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [48];
  FX local_c8 [64];
  undefined8 local_88;
  string local_80 [32];
  Subject local_60 [24];
  string local_48 [32];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  SubjectFactory subject_factory;
  SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test *this_local;
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory
            ((SubjectFactory *)&gtest_ar.message_,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_88 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Ndf();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"CSFX",&local_f9);
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                     (local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"EURGBP",&local_121);
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"EUR",&local_149);
  bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar2);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                              (1000000.0);
  pDVar4 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar3);
  this_00 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(this_00,0x7e2,9,0x17);
  puVar5 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::SettlementDate(pDVar4);
  (**(code **)*puVar5)(local_60);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_28,
             "\"AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20180923,Symbol=EURGBP,Tenor=1M,User=fbennett\""
             ,
             "subject_factory.Fx().Stream().Ndf() .LiquidityProvider(\"CSFX\") .CurrencyPair(\"EURGBP\") .Currency(\"EUR\") .Quantity(1000000) .Tenor(Tenor::IN_1_MONTH) .SettlementDate(new Date(2018, 9, 23)) .CreateSubject() .ToString().c_str()"
             ,
             "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20180923,Symbol=EURGBP,Tenor=1M,User=fbennett"
             ,pcVar6);
  std::__cxx11::string::~string(local_48);
  Subject::~Subject(local_60);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  SubjectFactory::FX::~FX(local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
               ,0x28f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_ndf_with_Tenor_and_settlement)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20180923,Symbol=EURGBP,Tenor=1M,User=fbennett",
            subject_factory.Fx().Stream().Ndf()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .Quantity(1000000)
                    .Tenor(Tenor::IN_1_MONTH)
                    .SettlementDate(new Date(2018, 9, 23))
                    .CreateSubject()
                    .ToString().c_str());
}